

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::sendError(Connection *this,Exception *exception)

{
  Exception *in_RDX;
  ArrayDisposer **ppAVar1;
  Promise<void> promise;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_1c8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_1c0;
  Exception *local_1b8;
  Exception local_1b0;
  
  *(undefined1 *)((long)exception->trace + 0xfc) = 1;
  ppAVar1 = &(exception->ownFile).content.disposer;
  if (*(ArrayDisposer ***)(exception->file + 0x50) != (ArrayDisposer **)0x0) {
    ppAVar1 = *(ArrayDisposer ***)(exception->file + 0x50);
  }
  Exception::Exception(&local_1b0,in_RDX);
  local_1b8 = (Exception *)0x0;
  if (*(char *)(exception->trace + 0x1c) != '\0') {
    local_1b8 = exception;
  }
  (*(code *)(*ppAVar1)[1]._vptr_ArrayDisposer)(&local_1c8,ppAVar1,&local_1b0);
  Exception::~Exception(&local_1b0);
  local_1c0.ptr = local_1c8.ptr;
  local_1c8.ptr = (PromiseNode *)0x0;
  finishSendingError(this,(Promise<void> *)exception);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1c0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1c8);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> sendError(kj::Exception&& exception) {
    closeAfterSend = true;

    // We only provide the Response object if we know we haven't already sent a response.
    auto promise = server.settings.errorHandler.orDefault(*this).handleApplicationError(
        kj::mv(exception), currentMethod.map([this](auto&&) -> Response& { return *this; }));
    return finishSendingError(kj::mv(promise));
  }